

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_option.c
# Opt level: O3

int mpt_parse_option(mpt_parser_format *fmt,mpt_parser_context *parse,mpt_path *path)

{
  uint val;
  int iVar1;
  ushort **ppuVar2;
  uint uVar3;
  
  val = mpt_parse_nextvis(&parse->src,fmt->com,4);
  if ((int)val < 0) {
    parse->curr = (parse->valid != 0) << 3 | 3;
    uVar3 = 0xffffffff;
    if (val == 0xfffffffe) {
      uVar3 = (uint)(path->len == 0) * 0x10 - 0x10;
    }
  }
  else if ((val == fmt->ostart || fmt->ostart == 0) || (parse->valid == 0)) {
    iVar1 = mpt_path_addchar(path,val);
    parse->curr = '\v';
    uVar3 = 0xffffffef;
    if (-1 < iVar1) {
      ppuVar2 = __ctype_b_loc();
      do {
        if ((*(byte *)((long)*ppuVar2 + (ulong)val * 2 + 1) & 0x20) == 0) {
          if (val == fmt->assign) goto LAB_0011a6cb;
          if (val == fmt->oend) {
LAB_0011a73e:
            parse->curr = '\x04';
            if (((parse->name).opt & 0x10) != 0) {
              return 4;
            }
            return -3;
          }
          if ((val != 0) &&
             ((((val == fmt->com[0] || (val == fmt->com[1])) || (val == fmt->com[2])) ||
              (val == fmt->com[3])))) {
            if (fmt->oend != 0) {
              return -2;
            }
            mpt_parse_endline(&parse->src);
            goto LAB_0011a73e;
          }
          iVar1 = mpt_path_valid(path);
          parse->valid = (uint16_t)iVar1;
        }
        else {
          if (fmt->assign == 0) {
LAB_0011a6cb:
            iVar1 = mpt_parse_ncheck(path->base + path->len + path->off,(ulong)parse->valid,
                                     (uint)(parse->name).opt);
            if (iVar1 < 0) {
              return -3;
            }
            iVar1 = mpt_path_add(path,(uint)parse->valid);
            if (iVar1 < 0) {
              return -0x11;
            }
            mpt_path_invalidate(path);
            parse->valid = 0;
            iVar1 = mpt_parse_data(fmt,parse,path);
            if (iVar1 < 0) {
              return iVar1;
            }
            return (uint)(iVar1 != 0) * 4 + 3;
          }
          if (val == 10) {
            if ((fmt->oend != '\0') && (fmt->oend != '\n')) {
              return -2;
            }
            goto LAB_0011a73e;
          }
        }
        val = mpt_parse_getchar(&parse->src,path);
      } while (-1 < (int)val);
      uVar3 = -(uint)(val != 0xfffffffe) | 0xfffffff0;
    }
  }
  else {
    parse->curr = '\v';
    uVar3 = 0xfffffffe;
  }
  return uVar3;
}

Assistant:

extern int mpt_parse_option(const MPT_STRUCT(parser_format) *fmt, MPT_STRUCT(parser_context) *parse, MPT_STRUCT(path) *path)
{
	int curr;
	
	/* get next visible character, no save */
	if ((curr = mpt_parse_nextvis(&parse->src, fmt->com, sizeof(fmt->com))) < 0) {
		parse->curr = parse->valid ? (MPT_PARSEFLAG(Option) | MPT_PARSEFLAG(Name)) : MPT_PARSEFLAG(Option);
		if (curr != -2) {
			return MPT_ERROR(BadArgument);
		}
		return path->len ? MPT_ERROR(MissingData) : 0;
	}
	if (fmt->ostart && curr != fmt->ostart && parse->valid){
		parse->curr = MPT_PARSEFLAG(Option) | MPT_PARSEFLAG(Name);
		return MPT_ERROR(BadValue);
	}
	if (mpt_path_addchar(path, curr) < 0) {
		parse->curr = MPT_PARSEFLAG(Option) | MPT_PARSEFLAG(Name);
		return MPT_ERROR(MissingBuffer);
	}
	parse->curr = MPT_PARSEFLAG(Option) | MPT_PARSEFLAG(Name);
	
	while (1) {
		/* option assign condition */
		if (isspace(curr)) {
			if (!fmt->assign) {
				if (mpt_parse_ncheck(path->base + path->off + path->len, parse->valid, parse->name.opt) < 0) {
					return MPT_ERROR(BadType);
				}
				if (mpt_path_add(path, parse->valid) < 0) {
					return MPT_ERROR(MissingBuffer);
				}
				/* clear trailing path data */
				mpt_path_invalidate(path);
				parse->valid = 0;
				
				if ((curr = mpt_parse_data(fmt, parse, path)) < 0) {
					return curr;
				}
				if (!curr) {
					return MPT_PARSEFLAG(Option);
				}
				return MPT_PARSEFLAG(Option) | MPT_PARSEFLAG(Data);
			}
			if (curr == '\n') {
				if (fmt->oend && curr != fmt->oend) {
					return MPT_ERROR(BadValue);
				}
				break;
			}
		}
		else if (curr == fmt->assign) {
			if (mpt_parse_ncheck(path->base + path->off + path->len, parse->valid, parse->name.opt) < 0) {
				return MPT_ERROR(BadType);
			}
			if (mpt_path_add(path, parse->valid) < 0) {
				return MPT_ERROR(MissingBuffer);
			}
			/* clear trailing path data */
			mpt_path_invalidate(path);
			parse->valid = 0;
			
			if ((curr = mpt_parse_data(fmt, parse, path)) < 0) {
				return curr;
			}
			if (!curr) {
				return MPT_PARSEFLAG(Option);
			}
			return MPT_PARSEFLAG(Option) | MPT_PARSEFLAG(Data);
		}
		/* option end detected */
		else if (curr == fmt->oend) {
			break;
		}
		/* comments: continue to line end without save */
		else if (MPT_iscomment(fmt, curr)) {
			if (fmt->oend) {
				return MPT_ERROR(BadValue);
			}
			(void) mpt_parse_endline(&parse->src);
			break;
		}
		else {
			parse->valid = mpt_path_valid(path);
		}
		if ((curr = mpt_parse_getchar(&parse->src, path)) < 0) {
			return (curr == -2) ? MPT_ERROR(MissingData) : MPT_ERROR(BadArgument);
		}
	}
	parse->curr = MPT_PARSEFLAG(Data);
	/* set zero length option name */
	if (!(parse->name.opt & MPT_NAMEFLAG(Empty))) {
		return MPT_ERROR(BadType);
	}
	return MPT_PARSEFLAG(Data);
}